

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-handle-fileno.c
# Opt level: O0

int get_tty_fd(void)

{
  int iVar1;
  
  iVar1 = open64("/dev/tty",0);
  return iVar1;
}

Assistant:

static int get_tty_fd(void) {
  /* Make sure we have an FD that refers to a tty */
#ifdef _WIN32
  HANDLE handle;
  handle = CreateFileA("conin$",
                       GENERIC_READ | GENERIC_WRITE,
                       FILE_SHARE_READ | FILE_SHARE_WRITE,
                       NULL,
                       OPEN_EXISTING,
                       FILE_ATTRIBUTE_NORMAL,
                       NULL);
  if (handle == INVALID_HANDLE_VALUE)
    return -1;
  return _open_osfhandle((intptr_t) handle, 0);
#else /* unix */
  return open("/dev/tty", O_RDONLY, 0);
#endif
}